

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestCoverageCommand::Clone(cmCTestCoverageCommand *this)

{
  cmCTestScriptHandler *pcVar1;
  cmCTestHandlerCommand *this_00;
  string *psVar2;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xe0);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestCoverageCommand_0070e6c8;
  psVar2 = &this_00[1].super_cmCTestCommand.super_cmCommand.Error;
  *(undefined4 *)&this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_dataplus._M_p = 0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_string_length = 0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2._M_allocated_capacity =
       (size_type)psVar2;
  *(string **)((long)&this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2 + 8) = psVar2;
  this_00[1].super_cmCTestCommand.CTest = (cmCTest *)0x0;
  *(undefined1 *)&this_00[1].super_cmCTestCommand.super_cmCommand._vptr_cmCommand = 0;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler = pcVar1;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestCoverageCommand* ni = new cmCTestCoverageCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }